

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getDest<wasm::MemoryCopy>
          (Replacer *this,MemoryCopy *curr,Name memory,Index sizeIdx,Expression *localSet,
          Expression *additionalCheck)

{
  Builder *this_00;
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  Expression *pEVar3;
  Index index;
  Block *value;
  Expression *leftOperand;
  Expression *rightOperand;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  undefined4 in_register_00000084;
  Type type;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type_00;
  Name memory_00;
  LocalSet *local_b0;
  Expression *destGet;
  LocalSet *local_a0;
  Expression *local_98;
  char *local_90;
  size_t local_88;
  Expression *local_80;
  Expression *local_78;
  LocalSet *local_70;
  LocalSet *local_68;
  Builder *local_60;
  Index local_58;
  Index local_54;
  undefined1 local_50 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  
  pEVar3 = additionalCheck;
  type.id = CONCAT44(in_register_00000084,sizeIdx);
  local_90 = memory.super_IString.str._M_str;
  local_88 = memory.super_IString.str._M_len;
  local_80 = localSet;
  value = (Block *)addOffsetGlobal(this,curr->dest,memory);
  if (this->parent->checkBounds == true) {
    local_78 = pEVar3;
    this_00 = &this->builder;
    local_58 = sizeIdx;
    local_70 = Builder::makeLocalSet(this_00,sizeIdx,curr->size);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->parent->pointerType).id;
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),type);
    local_60 = this_00;
    local_68 = Builder::makeLocalSet(this_00,index,(Expression *)value);
    uVar1 = (this->parent->pointerType).id;
    leftOperand = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    leftOperand->_id = LocalGetId;
    *(Index *)(leftOperand + 1) = index;
    (leftOperand->type).id = uVar1;
    uVar1 = (this->parent->pointerType).id;
    local_54 = index;
    rightOperand = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    pEVar3 = local_78;
    rightOperand->_id = LocalGetId;
    *(Index *)(rightOperand + 1) = local_58;
    (rightOperand->type).id = uVar1;
    memory_00.super_IString.str._M_str = local_90;
    memory_00.super_IString.str._M_len = local_88;
    local_98 = makeAddGtuMemoryTrap(this,leftOperand,rightOperand,memory_00);
    local_b0 = local_68;
    destGet = local_80;
    local_a0 = local_70;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_b0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,__l,
               (allocator_type *)
               ((long)&exprs.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (pEVar3 != (Expression *)0x0) {
      if (exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_50,
                   (iterator)
                   exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,&additionalCheck);
      }
      else {
        *exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_start = pEVar3;
        exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    uVar1 = (this->parent->pointerType).id;
    local_b0 = (LocalSet *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    (local_b0->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalGetId;
    local_b0->index = local_54;
    (local_b0->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = uVar1;
    if (exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_realloc_insert<wasm::Expression*const&>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_50,
                 (iterator)
                 exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(Expression **)&local_b0);
      uVar4 = extraout_RDX_00;
    }
    else {
      *exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_start = (Expression *)local_b0;
      exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
           .super__Vector_impl_data._M_start + 1;
      uVar4 = extraout_RDX;
    }
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar4;
    value = Builder::
            makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                      (local_60,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                local_50,type_00);
    if (local_50 != (undefined1  [8])0x0) {
      operator_delete((void *)local_50,
                      (long)exprs.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
    }
  }
  return (Expression *)value;
}

Assistant:

Expression* getDest(T* curr,
                        Name memory,
                        Index sizeIdx = Index(-1),
                        Expression* localSet = nullptr,
                        Expression* additionalCheck = nullptr) {
      Expression* destValue = addOffsetGlobal(curr->dest, memory);

      if (parent.checkBounds) {
        Expression* sizeSet = builder.makeLocalSet(sizeIdx, curr->size);
        Index destIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* destSet = builder.makeLocalSet(destIdx, destValue);
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(destIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          memory);
        std::vector<Expression*> exprs = {
          destSet, localSet, sizeSet, boundsCheck};
        if (additionalCheck) {
          exprs.push_back(additionalCheck);
        }
        Expression* destGet = builder.makeLocalGet(destIdx, parent.pointerType);
        exprs.push_back(destGet);
        return builder.makeBlock(exprs);
      }

      return destValue;
    }